

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_StrEq_Test::Body
          (iu_SyntaxTest_x_iutest_x_StrEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *p;
  char test [5];
  AssertionResult iutest_ar;
  type **in_stack_fffffffffffffde8;
  allocator<char> local_209;
  char local_208 [8];
  AssertionResult local_200;
  AssertionHelper local_1d8;
  undefined1 local_1a8 [392];
  
  builtin_strncpy(local_208,"test",5);
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&local_200,(internal *)0x33ddeb,"test","test",local_208,
             (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffde8);
  bVar2 = local_200.m_result;
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_209);
    local_1d8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x1a9;
    local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&local_200,(internal *)0x33ddeb,"test","test",local_208,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffde8);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_209);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x1ab;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    paVar1 = &local_200.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&local_200,(internal *)0x33ddeb,"test","test",local_208,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffde8);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_209);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x1ad;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
              (&local_200,(internal *)0x33ddeb,"test","test",local_208,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffde8);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_209);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x1af;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, StrEq)
{
    const char test[] = "test";
    if( const char* p = "test" )
        IUTEST_ASSERT_STREQ(p, test) << p;
    if( const char* p = "test" )
        IUTEST_EXPECT_STREQ(p, test) << p;
    if( const char* p = "test" )
        IUTEST_INFORM_STREQ(p, test) << p;
    if( const char* p = "test" )
        IUTEST_ASSUME_STREQ(p, test) << p;
}